

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O1

void PerfomanceTester<long_long,_void>::Test(void)

{
  size_t sVar1;
  char *__s;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[",1);
  __s = _sprintf + (*_sprintf == '*');
  sVar1 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"] skipped",9);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  return;
}

Assistant:

static void Test()
    {
        std::cerr << "[" << typeid(T).name() << "] skipped" << std::endl;
    }